

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_fwd.hpp
# Opt level: O2

void __thiscall
toml::detail::repeat_at_least::repeat_at_least(repeat_at_least *this,repeat_at_least *param_1)

{
  (this->super_scanner_base)._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_0045bbb8;
  this->length_ = param_1->length_;
  scanner_storage::scanner_storage(&this->other_,&param_1->other_);
  return;
}

Assistant:

repeat_at_least(const repeat_at_least&)            = default;